

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void text_getrect(t_gobj *z,_glist *glist,int *xp1,int *yp1,int *xp2,int *yp2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _rtext *x_00;
  int local_6c;
  _rtext *y;
  t_float y2;
  t_float x2;
  t_float y1;
  t_float x1;
  int iscomment;
  int height;
  int width;
  t_text *x;
  int *yp2_local;
  int *xp2_local;
  int *yp1_local;
  int *xp1_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  uVar1 = (uint)(((ulong)z[2].g_next & 0x3000000000000) == 0);
  if ((glist->gl_editor == (t_editor *)0x0) || (glist->gl_editor->e_rtext == (_rtext *)0x0)) {
    if ((((ulong)z[2].g_next & 0x3000000000000) == 0x3000000000000) &&
       (0 < *(short *)((long)&z[2].g_next + 4))) {
      if (*(short *)((long)&z[2].g_next + 4) < 1) {
        local_6c = 6;
      }
      else {
        local_6c = (int)*(short *)((long)&z[2].g_next + 4);
      }
      iVar2 = glist_fontwidth(glist);
      iVar4 = glist_fontheight(glist);
      iVar3 = glist_getzoom(glist);
      if (iVar3 < 2) {
        iscomment = local_6c * iVar2 + 2;
        x1 = (t_float)(iVar4 + 4);
      }
      else {
        iVar3 = glist_getzoom(glist);
        iscomment = iVar3 * 2 + local_6c * iVar2;
        iVar2 = glist_getzoom(glist);
        x1 = (t_float)(iVar2 * 4 + iVar4);
      }
    }
    else {
      x1 = 1.4013e-44;
      iscomment = 10;
    }
  }
  else {
    x_00 = glist_findrtext(glist,(t_text *)z);
    iscomment = rtext_width(x_00);
    iVar2 = rtext_height(x_00);
    x1 = (t_float)(iVar2 + uVar1 * -2);
  }
  iVar2 = text_xpix((t_text *)z,glist);
  iVar4 = text_ypix((t_text *)z,glist);
  *xp1 = (int)(float)iVar2;
  *yp1 = (int)((float)uVar1 + (float)iVar4);
  *xp2 = (int)((float)iVar2 + (float)iscomment);
  *yp2 = (int)((float)iVar4 + (float)(int)x1);
  return;
}

Assistant:

static void text_getrect(t_gobj *z, t_glist *glist,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_text *x = (t_text *)z;
    int width, height, iscomment = (x->te_type == T_TEXT);
    t_float x1, y1, x2, y2;

    if (glist->gl_editor && glist->gl_editor->e_rtext)
    {
        t_rtext *y = glist_findrtext(glist, x);
        width = rtext_width(y);
        height = rtext_height(y) - (iscomment << 1);
    }
        /* for number boxes, we know width and height a priori, and should
        report them here so that graphs can get swelled to fit. */

    else if (x->te_type == T_ATOM && x->te_width > 0)
    {
        width = (x->te_width > 0 ? x->te_width : 6) * glist_fontwidth(glist);
        height = glist_fontheight(glist);
        if (glist_getzoom(glist) > 1)
        {
            /* zoom margins */
            width += ATOM_RMARGIN * glist_getzoom(glist);
            height += ATOM_BMARGIN * glist_getzoom(glist);
        }
        else
        {
            width += ATOM_RMARGIN;
            height += ATOM_BMARGIN;
        }
    }
        /* if we're invisible we don't know our size so we just lie about
        it.  This is called on invisible boxes to establish order of inlets
        and possibly other reasons.
           To find out if the box is visible we can't just check the "vis"
        flag because we might be within the vis() routine and not have set
        that yet.  So we check directly whether the "rtext" list has been
        built.  LATER reconsider when "vis" flag should be on and off? */

    else width = height = 10;
    x1 = text_xpix(x, glist);
    y1 = text_ypix(x, glist);
    x2 = x1 + width;
    y2 = y1 + height;
    y1 += iscomment;
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}